

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O0

SUNErrCode Matvec_SparseCSC(SUNMatrix A,N_Vector x,N_Vector y)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  SUNContext_conflict sunctx_local_scope_;
  sunrealtype *yd;
  sunrealtype *xd;
  sunrealtype *Ax;
  sunindextype *Ai;
  sunindextype *Ap;
  sunindextype j;
  sunindextype i;
  undefined8 local_28;
  undefined8 local_20;
  
  lVar1 = *(long *)(*in_RDI + 0x38);
  lVar2 = *(long *)(*in_RDI + 0x30);
  lVar3 = *(long *)(*in_RDI + 0x20);
  lVar5 = N_VGetArrayPointer(in_RSI);
  lVar6 = N_VGetArrayPointer(in_RDX);
  for (local_20 = 0; local_20 < *(long *)*in_RDI; local_20 = local_20 + 1) {
    *(undefined8 *)(lVar6 + local_20 * 8) = 0;
  }
  for (local_28 = 0; local_28 < *(long *)(*in_RDI + 8); local_28 = local_28 + 1) {
    for (local_20 = *(long *)(lVar1 + local_28 * 8); local_20 < *(long *)(lVar1 + 8 + local_28 * 8);
        local_20 = local_20 + 1) {
      lVar4 = *(long *)(lVar2 + local_20 * 8);
      *(double *)(lVar6 + lVar4 * 8) =
           *(double *)(lVar3 + local_20 * 8) * *(double *)(lVar5 + local_28 * 8) +
           *(double *)(lVar6 + lVar4 * 8);
    }
  }
  return 0;
}

Assistant:

SUNErrCode Matvec_SparseCSC(SUNMatrix A, N_Vector x, N_Vector y)
{
  sunindextype i, j;
  sunindextype *Ap, *Ai;
  sunrealtype *Ax, *xd, *yd;
  SUNFunctionBegin(A->sunctx);

  /* access data from CSC structure (return if failure) */
  Ap = SM_INDEXPTRS_S(A);
  SUNAssert(Ap, SUN_ERR_ARG_CORRUPT);
  Ai = SM_INDEXVALS_S(A);
  SUNAssert(Ai, SUN_ERR_ARG_CORRUPT);
  Ax = SM_DATA_S(A);
  SUNAssert(Ax, SUN_ERR_ARG_CORRUPT);

  /* access vector data (return if failure) */
  xd = N_VGetArrayPointer(x);
  SUNCheckLastErr();
  yd = N_VGetArrayPointer(y);
  SUNCheckLastErr();

  /* initialize result */
  for (i = 0; i < SM_ROWS_S(A); i++) { yd[i] = ZERO; }

  /* iterate through matrix columns */
  for (j = 0; j < SM_COLUMNS_S(A); j++)
  {
    /* iterate down column of A, performing product */
    for (i = Ap[j]; i < Ap[j + 1]; i++) { yd[Ai[i]] += Ax[i] * xd[j]; }
  }

  return SUN_SUCCESS;
}